

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O0

OPJ_BOOL opj_pi_check_next_level
                   (OPJ_INT32 pos,opj_cp_t *cp,OPJ_UINT32 tileno,OPJ_UINT32 pino,OPJ_CHAR *prog)

{
  opj_tcp_t *poVar1;
  OPJ_BOOL OVar2;
  opj_poc_t *tcp;
  opj_tcp_t *tcps;
  OPJ_INT32 i;
  OPJ_CHAR *prog_local;
  OPJ_UINT32 pino_local;
  OPJ_UINT32 tileno_local;
  opj_cp_t *cp_local;
  OPJ_INT32 pos_local;
  
  poVar1 = cp->tcps;
  tcps._4_4_ = pos;
  if (-1 < pos) {
    while (-1 < pos) {
      switch(prog[tcps._4_4_]) {
      case 'C':
        if (poVar1[tileno].pocs[pino].comp_t != poVar1[tileno].pocs[pino].compE) {
          return 1;
        }
        OVar2 = opj_pi_check_next_level(pos + -1,cp,tileno,pino,prog);
        if (OVar2 != 0) {
          return 1;
        }
        return 0;
      default:
        tcps._4_4_ = tcps._4_4_ + -1;
        break;
      case 'L':
        if (poVar1[tileno].pocs[pino].lay_t != poVar1[tileno].pocs[pino].layE) {
          return 1;
        }
        OVar2 = opj_pi_check_next_level(pos + -1,cp,tileno,pino,prog);
        if (OVar2 != 0) {
          return 1;
        }
        return 0;
      case 'P':
        if (1 < (uint)poVar1[tileno].pocs[pino].prg) {
          if (poVar1[tileno].pocs[pino].tx0_t != poVar1[tileno].pocs[pino].txE) {
            return 1;
          }
          if (poVar1[tileno].pocs[pino].ty0_t == poVar1[tileno].pocs[pino].tyE) {
            OVar2 = opj_pi_check_next_level(tcps._4_4_ + -1,cp,tileno,pino,prog);
            if (OVar2 != 0) {
              return 1;
            }
            return 0;
          }
          return 1;
        }
        if (poVar1[tileno].pocs[pino].prc_t != poVar1[tileno].pocs[pino].prcE) {
          return 1;
        }
        OVar2 = opj_pi_check_next_level(tcps._4_4_ + -1,cp,tileno,pino,prog);
        if (OVar2 != 0) {
          return 1;
        }
        return 0;
      case 'R':
        if (poVar1[tileno].pocs[pino].res_t != poVar1[tileno].pocs[pino].resE) {
          return 1;
        }
        OVar2 = opj_pi_check_next_level(pos + -1,cp,tileno,pino,prog);
        if (OVar2 != 0) {
          return 1;
        }
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

static OPJ_BOOL opj_pi_check_next_level(OPJ_INT32 pos,
                                        opj_cp_t *cp,
                                        OPJ_UINT32 tileno,
                                        OPJ_UINT32 pino,
                                        const OPJ_CHAR *prog)
{
    OPJ_INT32 i;
    opj_tcp_t *tcps = &cp->tcps[tileno];
    opj_poc_t *tcp = &tcps->pocs[pino];

    if (pos >= 0) {
        for (i = pos; pos >= 0; i--) {
            switch (prog[i]) {
            case 'R':
                if (tcp->res_t == tcp->resE) {
                    if (opj_pi_check_next_level(pos - 1, cp, tileno, pino, prog)) {
                        return OPJ_TRUE;
                    } else {
                        return OPJ_FALSE;
                    }
                } else {
                    return OPJ_TRUE;
                }
                break;
            case 'C':
                if (tcp->comp_t == tcp->compE) {
                    if (opj_pi_check_next_level(pos - 1, cp, tileno, pino, prog)) {
                        return OPJ_TRUE;
                    } else {
                        return OPJ_FALSE;
                    }
                } else {
                    return OPJ_TRUE;
                }
                break;
            case 'L':
                if (tcp->lay_t == tcp->layE) {
                    if (opj_pi_check_next_level(pos - 1, cp, tileno, pino, prog)) {
                        return OPJ_TRUE;
                    } else {
                        return OPJ_FALSE;
                    }
                } else {
                    return OPJ_TRUE;
                }
                break;
            case 'P':
                switch (tcp->prg) {
                case OPJ_LRCP: /* fall through */
                case OPJ_RLCP:
                    if (tcp->prc_t == tcp->prcE) {
                        if (opj_pi_check_next_level(i - 1, cp, tileno, pino, prog)) {
                            return OPJ_TRUE;
                        } else {
                            return OPJ_FALSE;
                        }
                    } else {
                        return OPJ_TRUE;
                    }
                    break;
                default:
                    if (tcp->tx0_t == tcp->txE) {
                        /*TY*/
                        if (tcp->ty0_t == tcp->tyE) {
                            if (opj_pi_check_next_level(i - 1, cp, tileno, pino, prog)) {
                                return OPJ_TRUE;
                            } else {
                                return OPJ_FALSE;
                            }
                        } else {
                            return OPJ_TRUE;
                        }/*TY*/
                    } else {
                        return OPJ_TRUE;
                    }
                    break;
                }/*end case P*/
            }/*end switch*/
        }/*end for*/
    }/*end if*/
    return OPJ_FALSE;
}